

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O2

void render_url_escaped(MD_HTML *r,MD_CHAR *data,MD_SIZE size)

{
  byte bVar1;
  undefined8 in_RAX;
  void *pvVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  MD_SIZE MVar6;
  ulong uVar7;
  MD_SIZE MStack_40;
  undefined5 uStack_38;
  char hex [3];
  
  uVar7 = 0;
  _uStack_38 = in_RAX;
  do {
    uVar5 = (uint)uVar7;
    uVar4 = uVar7;
    MVar6 = uVar5;
    if (uVar5 <= size) {
      MVar6 = size;
    }
    for (; uVar4 < size; uVar4 = uVar4 + 1) {
      if ((r->escape_map[(byte)data[uVar4]] & 2U) != 0) {
        MVar6 = (MD_SIZE)uVar4;
        break;
      }
    }
    if (uVar5 < MVar6) {
      (*r->process_output)(data + uVar7,MVar6 - uVar5,r->userdata);
    }
    if (size <= uVar4) {
      return;
    }
    bVar1 = data[MVar6];
    if (bVar1 == 0x26) {
      pvVar2 = r->userdata;
      pcVar3 = "&amp;";
      MStack_40 = 5;
    }
    else {
      _uStack_38 = CONCAT17("0123456789ABCDEF"[bVar1 & 0xf],
                            CONCAT16("0123456789ABCDEF"[bVar1 >> 4],CONCAT15(0x25,uStack_38)));
      pvVar2 = r->userdata;
      pcVar3 = hex;
      MStack_40 = 3;
    }
    (*r->process_output)(pcVar3,MStack_40,pvVar2);
    uVar7 = (ulong)(MVar6 + 1);
  } while( true );
}

Assistant:

static void
render_url_escaped(MD_HTML* r, const MD_CHAR* data, MD_SIZE size)
{
    static const MD_CHAR hex_chars[] = "0123456789ABCDEF";
    MD_OFFSET beg = 0;
    MD_OFFSET off = 0;

    /* Some characters need to be escaped in URL attributes. */
    #define NEED_URL_ESC(ch)    (r->escape_map[(unsigned char)(ch)] & NEED_URL_ESC_FLAG)

    while(1) {
        while(off < size  &&  !NEED_URL_ESC(data[off]))
            off++;
        if(off > beg)
            render_verbatim(r, data + beg, off - beg);

        if(off < size) {
            char hex[3];

            switch(data[off]) {
                case '&':   RENDER_VERBATIM(r, "&amp;"); break;
                default:
                    hex[0] = '%';
                    hex[1] = hex_chars[((unsigned)data[off] >> 4) & 0xf];
                    hex[2] = hex_chars[((unsigned)data[off] >> 0) & 0xf];
                    render_verbatim(r, hex, 3);
                    break;
            }
            off++;
        } else {
            break;
        }

        beg = off;
    }
}